

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::SwitchStmt::remove_switch_case(SwitchStmt *this,shared_ptr<kratos::Const> *switch_case)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  shared_ptr<kratos::Const> *local_18;
  shared_ptr<kratos::Const> *switch_case_local;
  SwitchStmt *this_local;
  
  local_18 = switch_case;
  switch_case_local = (shared_ptr<kratos::Const> *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::find(&this->body_,switch_case);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::end(&this->body_);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::
    map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::erase(&this->body_,local_18);
  }
  return;
}

Assistant:

void SwitchStmt::remove_switch_case(const std::shared_ptr<kratos::Const> &switch_case) {
    if (body_.find(switch_case) != body_.end()) {
        body_.erase(switch_case);
    }
}